

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O0

int i2cWriteByte(uint handle,uint bVal)

{
  FILE *pFVar1;
  char *pcVar2;
  uint in_ESI;
  uint in_EDI;
  uint8_t unaff_retaddr;
  char unaff_retaddr_00;
  int unaff_retaddr_01;
  int status;
  undefined4 in_stack_fffffffffffffff0;
  int in_stack_fffffffffffffffc;
  uint uVar3;
  
  pFVar1 = _stderr;
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals & 0x400) == 0)) {
    pcVar2 = myTimeStamp();
    fprintf(pFVar1,"%s %s: handle=%d bVal=%d\n",pcVar2,"i2cWriteByte",(ulong)in_EDI,(ulong)in_ESI);
  }
  pFVar1 = _stderr;
  if (libInitialised == 0) {
    if ((gpioCfg.internals & 0x400) == 0) {
      pcVar2 = myTimeStamp();
      fprintf(pFVar1,"%s %s: pigpio uninitialised, call gpioInitialise()\n",pcVar2,"i2cWriteByte");
    }
    uVar3 = 0xffffffe1;
  }
  else if (in_EDI < 0x40) {
    if (i2cInfo[in_EDI].state == 2) {
      if ((i2cInfo[in_EDI].funcs & 0x40000) == 0) {
        if ((gpioCfg.internals & 0x400) == 0) {
          pcVar2 = myTimeStamp();
          fprintf(pFVar1,"%s %s: SMBUS command not supported by driver\n",pcVar2,"i2cWriteByte");
        }
        uVar3 = 0xffffff95;
      }
      else if (in_ESI < 0x100) {
        uVar3 = my_smbus_access(unaff_retaddr_01,unaff_retaddr_00,unaff_retaddr,
                                in_stack_fffffffffffffffc,
                                (my_smbus_data *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
        pFVar1 = _stderr;
        if ((int)uVar3 < 0) {
          if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals & 0x400) == 0)) {
            pcVar2 = myTimeStamp();
            fprintf(pFVar1,"%s %s: error=%d (%m)\n",pcVar2,"i2cWriteByte",(ulong)uVar3);
          }
          uVar3 = 0xffffffae;
        }
      }
      else {
        if ((gpioCfg.internals & 0x400) == 0) {
          pcVar2 = myTimeStamp();
          fprintf(pFVar1,"%s %s: bad bVal (%d)\n",pcVar2,"i2cWriteByte",(ulong)in_ESI);
        }
        uVar3 = 0xffffffaf;
      }
    }
    else {
      if ((gpioCfg.internals & 0x400) == 0) {
        pcVar2 = myTimeStamp();
        fprintf(pFVar1,"%s %s: bad handle (%d)\n",pcVar2,"i2cWriteByte",(ulong)in_EDI);
      }
      uVar3 = 0xffffffe7;
    }
  }
  else {
    if ((gpioCfg.internals & 0x400) == 0) {
      pcVar2 = myTimeStamp();
      fprintf(pFVar1,"%s %s: bad handle (%d)\n",pcVar2,"i2cWriteByte",(ulong)in_EDI);
    }
    uVar3 = 0xffffffe7;
  }
  return uVar3;
}

Assistant:

int i2cWriteByte(unsigned handle, unsigned bVal)
{
   int status;

   DBG(DBG_USER, "handle=%d bVal=%d", handle, bVal);

   CHECK_INITED;

   if (handle >= PI_I2C_SLOTS)
      SOFT_ERROR(PI_BAD_HANDLE, "bad handle (%d)", handle);

   if (i2cInfo[handle].state != PI_I2C_OPENED)
      SOFT_ERROR(PI_BAD_HANDLE, "bad handle (%d)", handle);

   if ((i2cInfo[handle].funcs & PI_I2C_FUNC_SMBUS_WRITE_BYTE) == 0)
      SOFT_ERROR(PI_BAD_SMBUS_CMD, "SMBUS command not supported by driver");

   if (bVal > 0xFF)
      SOFT_ERROR(PI_BAD_PARAM, "bad bVal (%d)", bVal);

   status = my_smbus_access(
            i2cInfo[handle].fd,
            PI_I2C_SMBUS_WRITE,
            bVal,
            PI_I2C_SMBUS_BYTE,
            NULL);

   if (status < 0)
   {
      DBG(DBG_USER, "error=%d (%m)", status);
      return PI_I2C_WRITE_FAILED;
   }

   return status;
}